

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O0

void __thiscall FIX50::Message::Message(Message *this,MsgType *msgtype)

{
  Header *this_00;
  allocator<char> local_121;
  STRING local_120;
  FieldBase local_100;
  allocator<char> local_91;
  STRING local_90;
  BeginString local_70;
  MsgType *local_18;
  MsgType *msgtype_local;
  Message *this_local;
  
  local_18 = msgtype;
  msgtype_local = (MsgType *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"FIXT.1.1",&local_91);
  FIX::BeginString::BeginString(&local_70,&local_90);
  FIX::Message::Message(&this->super_Message,&local_70,local_18);
  FIX::BeginString::~BeginString(&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  *(undefined ***)this = &PTR__Message_0018a1d8;
  this_00 = getHeader(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"7",&local_121);
  FIX::ApplVerID::ApplVerID((ApplVerID *)&local_100,&local_120);
  FIX::FieldMap::setField((FieldMap *)this_00,&local_100,true);
  FIX::ApplVerID::~ApplVerID((ApplVerID *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  return;
}

Assistant:

Message( const FIX::MsgType& msgtype )
    : FIX::Message(
      FIX::BeginString("FIXT.1.1"), msgtype )
     { getHeader().setField( FIX::ApplVerID("7") ); }